

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::FastText(FastText *this)

{
  undefined1 auVar1 [32];
  
  (this->start_).__d.__r = 0;
  this->quant_ = false;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->args_ = (shared_ptr<fasttext::Args>)auVar1._0_16_;
  this->dict_ = (shared_ptr<fasttext::Dictionary>)auVar1._16_16_;
  this->input_ = (shared_ptr<fasttext::Matrix>)auVar1._0_16_;
  this->output_ = (shared_ptr<fasttext::Matrix>)auVar1._16_16_;
  *(undefined1 (*) [32])
   ((long)&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  this->wordVectors_ =
       (unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>)
       SUB168(ZEXT416(0) << 0x40,0);
  this->wordVectorsMod =
       (unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>)
       SUB168(ZEXT416(0) << 0x40,8);
  (this->trainException_)._M_exception_object = (void *)0x0;
  return;
}

Assistant:

FastText::FastText()
    : quant_(false), wordVectors_(nullptr), trainException_(nullptr) {}